

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Model::MergeFrom(Model *this,Model *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  ModelDescription *pMVar3;
  GLMClassifier *pGVar4;
  OneHotEncoder *pOVar5;
  TextClassifier *pTVar6;
  GLMRegressor *pGVar7;
  LinkedModel *pLVar8;
  Pipeline *pPVar9;
  SerializedModel *pSVar10;
  ItemSimilarityRecommender *pIVar11;
  FeatureVectorizer *pFVar12;
  DictVectorizer *pDVar13;
  Imputer *pIVar14;
  CategoricalMapping *pCVar15;
  Normalizer *pNVar16;
  Scaler *pSVar17;
  ArrayFeatureExtractor *pAVar18;
  NonMaximumSuppression *pNVar19;
  BayesianProbitRegressor *pBVar20;
  Gazetteer *pGVar21;
  TreeEnsembleRegressor *pTVar22;
  KNearestNeighborsClassifier *pKVar23;
  VisionFeaturePrint *pVVar24;
  NeuralNetworkRegressor *pNVar25;
  SupportVectorRegressor *pSVar26;
  PipelineClassifier *pPVar27;
  NeuralNetwork *pNVar28;
  SoundAnalysisPreprocessing *pSVar29;
  CustomModel *pCVar30;
  TreeEnsembleClassifier *pTVar31;
  WordTagger *pWVar32;
  NeuralNetworkClassifier *pNVar33;
  Program *pPVar34;
  PipelineRegressor *pPVar35;
  Identity *pIVar36;
  SupportVectorClassifier *pSVar37;
  WordEmbedding *pWVar38;
  AudioFeaturePrint *pAVar39;
  FeatureVectorizer *from_00;
  OneHotEncoder *from_01;
  DictVectorizer *from_02;
  Imputer *from_03;
  CategoricalMapping *from_04;
  Normalizer *from_05;
  Scaler *from_06;
  ArrayFeatureExtractor *from_07;
  NonMaximumSuppression *from_08;
  BayesianProbitRegressor *from_09;
  Gazetteer *from_10;
  TreeEnsembleRegressor *from_11;
  KNearestNeighborsClassifier *from_12;
  VisionFeaturePrint *from_13;
  NeuralNetworkRegressor *from_14;
  GLMRegressor *from_15;
  SupportVectorRegressor *from_16;
  NeuralNetwork *from_17;
  SoundAnalysisPreprocessing *from_18;
  CustomModel *from_19;
  TreeEnsembleClassifier *from_20;
  TextClassifier *from_21;
  WordTagger *from_22;
  NeuralNetworkClassifier *from_23;
  ItemSimilarityRecommender *from_24;
  LinkedModel *from_25;
  Program *from_26;
  Identity *from_27;
  GLMClassifier *from_28;
  SupportVectorClassifier *from_29;
  WordEmbedding *from_30;
  AudioFeaturePrint *from_31;
  PipelineClassifier *from_32;
  Pipeline *from_33;
  SerializedModel *from_34;
  PipelineRegressor *from_35;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/Model.pb.cc"
               ,0x11a5);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if ((from != (Model *)&_Model_default_instance_) &&
     (from->description_ != (ModelDescription *)0x0)) {
    if (this->description_ == (ModelDescription *)0x0) {
      pMVar3 = (ModelDescription *)operator_new(0x78);
      ModelDescription::ModelDescription(pMVar3);
      this->description_ = pMVar3;
    }
    pMVar3 = from->description_;
    if (pMVar3 == (ModelDescription *)0x0) {
      pMVar3 = (ModelDescription *)&_ModelDescription_default_instance_;
    }
    ModelDescription::MergeFrom(this->description_,pMVar3);
  }
  if (from->specificationversion_ != 0) {
    this->specificationversion_ = from->specificationversion_;
  }
  if (from->isupdatable_ == true) {
    this->isupdatable_ = true;
  }
  uVar1 = from->_oneof_case_[0];
  if ((int)uVar1 < 600) {
    if ((int)uVar1 < 400) {
      if ((int)uVar1 < 300) {
        if (uVar1 == 200) {
          if (this->_oneof_case_[0] != 200) {
            clear_Type(this);
            this->_oneof_case_[0] = 200;
            pPVar27 = (PipelineClassifier *)operator_new(0x20);
            PipelineClassifier::PipelineClassifier(pPVar27);
            (this->Type_).pipelineclassifier_ = pPVar27;
          }
          pPVar27 = (this->Type_).pipelineclassifier_;
          if (from->_oneof_case_[0] == 200) {
            from_32 = (from->Type_).pipelineclassifier_;
          }
          else {
            protobuf_Model_2eproto::InitDefaults();
            from_32 = (PipelineClassifier *)&_PipelineClassifier_default_instance_;
          }
          PipelineClassifier::MergeFrom(pPVar27,from_32);
        }
        else if (uVar1 == 0xc9) {
          if (this->_oneof_case_[0] != 0xc9) {
            clear_Type(this);
            this->_oneof_case_[0] = 0xc9;
            pPVar35 = (PipelineRegressor *)operator_new(0x20);
            PipelineRegressor::PipelineRegressor(pPVar35);
            (this->Type_).pipelineregressor_ = pPVar35;
          }
          pPVar35 = (this->Type_).pipelineregressor_;
          if (from->_oneof_case_[0] == 0xc9) {
            from_35 = (from->Type_).pipelineregressor_;
          }
          else {
            protobuf_Model_2eproto::InitDefaults();
            from_35 = (PipelineRegressor *)&_PipelineRegressor_default_instance_;
          }
          PipelineRegressor::MergeFrom(pPVar35,from_35);
        }
        else if (uVar1 == 0xca) {
          if (this->_oneof_case_[0] != 0xca) {
            clear_Type(this);
            this->_oneof_case_[0] = 0xca;
            pPVar9 = (Pipeline *)operator_new(0x48);
            Pipeline::Pipeline(pPVar9);
            (this->Type_).pipeline_ = pPVar9;
          }
          pPVar9 = (this->Type_).pipeline_;
          if (from->_oneof_case_[0] == 0xca) {
            from_33 = (from->Type_).pipeline_;
          }
          else {
            protobuf_Model_2eproto::InitDefaults();
            from_33 = (Pipeline *)&_Pipeline_default_instance_;
          }
          Pipeline::MergeFrom(pPVar9,from_33);
        }
      }
      else {
        switch(uVar1) {
        case 300:
          if (this->_oneof_case_[0] != 300) {
            clear_Type(this);
            this->_oneof_case_[0] = 300;
            pGVar7 = (GLMRegressor *)operator_new(0x48);
            GLMRegressor::GLMRegressor(pGVar7);
            (this->Type_).glmregressor_ = pGVar7;
          }
          pGVar7 = (this->Type_).glmregressor_;
          if (from->_oneof_case_[0] == 300) {
            from_15 = (from->Type_).glmregressor_;
          }
          else {
            from_15 = GLMRegressor::default_instance();
          }
          GLMRegressor::MergeFrom(pGVar7,from_15);
          break;
        case 0x12d:
          if (this->_oneof_case_[0] != 0x12d) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12d;
            pSVar26 = (SupportVectorRegressor *)operator_new(0x38);
            SupportVectorRegressor::SupportVectorRegressor(pSVar26);
            (this->Type_).supportvectorregressor_ = pSVar26;
          }
          pSVar26 = (this->Type_).supportvectorregressor_;
          if (from->_oneof_case_[0] == 0x12d) {
            from_16 = (from->Type_).supportvectorregressor_;
          }
          else {
            from_16 = SupportVectorRegressor::default_instance();
          }
          SupportVectorRegressor::MergeFrom(pSVar26,from_16);
          break;
        case 0x12e:
          if (this->_oneof_case_[0] != 0x12e) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12e;
            pTVar22 = (TreeEnsembleRegressor *)operator_new(0x20);
            TreeEnsembleRegressor::TreeEnsembleRegressor(pTVar22);
            (this->Type_).treeensembleregressor_ = pTVar22;
          }
          pTVar22 = (this->Type_).treeensembleregressor_;
          if (from->_oneof_case_[0] == 0x12e) {
            from_11 = (from->Type_).treeensembleregressor_;
          }
          else {
            from_11 = TreeEnsembleRegressor::default_instance();
          }
          TreeEnsembleRegressor::MergeFrom(pTVar22,from_11);
          break;
        case 0x12f:
          if (this->_oneof_case_[0] != 0x12f) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12f;
            pNVar25 = (NeuralNetworkRegressor *)operator_new(0x58);
            NeuralNetworkRegressor::NeuralNetworkRegressor(pNVar25);
            (this->Type_).neuralnetworkregressor_ = pNVar25;
          }
          pNVar25 = (this->Type_).neuralnetworkregressor_;
          if (from->_oneof_case_[0] == 0x12f) {
            from_14 = (from->Type_).neuralnetworkregressor_;
          }
          else {
            from_14 = NeuralNetworkRegressor::default_instance();
          }
          NeuralNetworkRegressor::MergeFrom(pNVar25,from_14);
          break;
        case 0x130:
          if (this->_oneof_case_[0] != 0x130) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x130;
            pBVar20 = (BayesianProbitRegressor *)operator_new(0x78);
            BayesianProbitRegressor::BayesianProbitRegressor(pBVar20);
            (this->Type_).bayesianprobitregressor_ = pBVar20;
          }
          pBVar20 = (this->Type_).bayesianprobitregressor_;
          if (from->_oneof_case_[0] == 0x130) {
            from_09 = (from->Type_).bayesianprobitregressor_;
          }
          else {
            from_09 = BayesianProbitRegressor::default_instance();
          }
          BayesianProbitRegressor::MergeFrom(pBVar20,from_09);
        }
      }
    }
    else if ((int)uVar1 < 500) {
      switch(uVar1) {
      case 400:
        if (this->_oneof_case_[0] != 400) {
          clear_Type(this);
          this->_oneof_case_[0] = 400;
          pGVar4 = (GLMClassifier *)operator_new(0x58);
          GLMClassifier::GLMClassifier(pGVar4);
          (this->Type_).glmclassifier_ = pGVar4;
        }
        pGVar4 = (this->Type_).glmclassifier_;
        if (from->_oneof_case_[0] == 400) {
          from_28 = (from->Type_).glmclassifier_;
        }
        else {
          from_28 = GLMClassifier::default_instance();
        }
        GLMClassifier::MergeFrom(pGVar4,from_28);
        break;
      case 0x191:
        if (this->_oneof_case_[0] != 0x191) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x191;
          pSVar37 = (SupportVectorClassifier *)operator_new(0xb0);
          SupportVectorClassifier::SupportVectorClassifier(pSVar37);
          (this->Type_).supportvectorclassifier_ = pSVar37;
        }
        pSVar37 = (this->Type_).supportvectorclassifier_;
        if (from->_oneof_case_[0] == 0x191) {
          from_29 = (from->Type_).supportvectorclassifier_;
        }
        else {
          from_29 = SupportVectorClassifier::default_instance();
        }
        SupportVectorClassifier::MergeFrom(pSVar37,from_29);
        break;
      case 0x192:
        if (this->_oneof_case_[0] != 0x192) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x192;
          pTVar31 = (TreeEnsembleClassifier *)operator_new(0x30);
          TreeEnsembleClassifier::TreeEnsembleClassifier(pTVar31);
          (this->Type_).treeensembleclassifier_ = pTVar31;
        }
        pTVar31 = (this->Type_).treeensembleclassifier_;
        if (from->_oneof_case_[0] == 0x192) {
          from_20 = (from->Type_).treeensembleclassifier_;
        }
        else {
          from_20 = TreeEnsembleClassifier::default_instance();
        }
        TreeEnsembleClassifier::MergeFrom(pTVar31,from_20);
        break;
      case 0x193:
        if (this->_oneof_case_[0] != 0x193) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x193;
          pNVar33 = (NeuralNetworkClassifier *)operator_new(0x68);
          NeuralNetworkClassifier::NeuralNetworkClassifier(pNVar33);
          (this->Type_).neuralnetworkclassifier_ = pNVar33;
        }
        pNVar33 = (this->Type_).neuralnetworkclassifier_;
        if (from->_oneof_case_[0] == 0x193) {
          from_23 = (from->Type_).neuralnetworkclassifier_;
        }
        else {
          from_23 = NeuralNetworkClassifier::default_instance();
        }
        NeuralNetworkClassifier::MergeFrom(pNVar33,from_23);
        break;
      case 0x194:
        if (this->_oneof_case_[0] != 0x194) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x194;
          pKVar23 = (KNearestNeighborsClassifier *)operator_new(0x48);
          KNearestNeighborsClassifier::KNearestNeighborsClassifier(pKVar23);
          (this->Type_).knearestneighborsclassifier_ = pKVar23;
        }
        pKVar23 = (this->Type_).knearestneighborsclassifier_;
        if (from->_oneof_case_[0] == 0x194) {
          from_12 = (from->Type_).knearestneighborsclassifier_;
        }
        else {
          from_12 = KNearestNeighborsClassifier::default_instance();
        }
        KNearestNeighborsClassifier::MergeFrom(pKVar23,from_12);
      }
    }
    else if ((int)uVar1 < 0x1f6) {
      if (uVar1 == 500) {
        if (this->_oneof_case_[0] != 500) {
          clear_Type(this);
          this->_oneof_case_[0] = 500;
          pNVar28 = (NeuralNetwork *)operator_new(0x58);
          NeuralNetwork::NeuralNetwork(pNVar28);
          (this->Type_).neuralnetwork_ = pNVar28;
        }
        pNVar28 = (this->Type_).neuralnetwork_;
        if (from->_oneof_case_[0] == 500) {
          from_17 = (from->Type_).neuralnetwork_;
        }
        else {
          from_17 = NeuralNetwork::default_instance();
        }
        NeuralNetwork::MergeFrom(pNVar28,from_17);
      }
      else if (uVar1 == 0x1f5) {
        if (this->_oneof_case_[0] != 0x1f5) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x1f5;
          pIVar11 = (ItemSimilarityRecommender *)operator_new(0x70);
          ItemSimilarityRecommender::ItemSimilarityRecommender(pIVar11);
          (this->Type_).itemsimilarityrecommender_ = pIVar11;
        }
        pIVar11 = (this->Type_).itemsimilarityrecommender_;
        if (from->_oneof_case_[0] == 0x1f5) {
          from_24 = (from->Type_).itemsimilarityrecommender_;
        }
        else {
          from_24 = ItemSimilarityRecommender::default_instance();
        }
        ItemSimilarityRecommender::MergeFrom(pIVar11,from_24);
      }
    }
    else if (uVar1 == 0x1f6) {
      if (this->_oneof_case_[0] != 0x1f6) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x1f6;
        pPVar34 = (Program *)operator_new(0x68);
        MILSpec::Program::Program(pPVar34);
        (this->Type_).mlprogram_ = pPVar34;
      }
      pPVar34 = (this->Type_).mlprogram_;
      if (from->_oneof_case_[0] == 0x1f6) {
        from_26 = (from->Type_).mlprogram_;
      }
      else {
        from_26 = MILSpec::Program::default_instance();
      }
      MILSpec::Program::MergeFrom(pPVar34,from_26);
    }
    else if (uVar1 == 0x22b) {
      if (this->_oneof_case_[0] != 0x22b) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x22b;
        pCVar30 = (CustomModel *)operator_new(0x48);
        CustomModel::CustomModel(pCVar30);
        (this->Type_).custommodel_ = pCVar30;
      }
      pCVar30 = (this->Type_).custommodel_;
      if (from->_oneof_case_[0] == 0x22b) {
        from_19 = (from->Type_).custommodel_;
      }
      else {
        from_19 = CustomModel::default_instance();
      }
      CustomModel::MergeFrom(pCVar30,from_19);
    }
    else if (uVar1 == 0x22c) {
      if (this->_oneof_case_[0] != 0x22c) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x22c;
        pLVar8 = (LinkedModel *)operator_new(0x20);
        LinkedModel::LinkedModel(pLVar8);
        (this->Type_).linkedmodel_ = pLVar8;
      }
      pLVar8 = (this->Type_).linkedmodel_;
      if (from->_oneof_case_[0] == 0x22c) {
        from_25 = (from->Type_).linkedmodel_;
      }
      else {
        from_25 = LinkedModel::default_instance();
      }
      LinkedModel::MergeFrom(pLVar8,from_25);
    }
  }
  else if ((int)uVar1 < 900) {
    switch(uVar1) {
    case 600:
      if (this->_oneof_case_[0] != 600) {
        clear_Type(this);
        this->_oneof_case_[0] = 600;
        pOVar5 = (OneHotEncoder *)operator_new(0x28);
        OneHotEncoder::OneHotEncoder(pOVar5);
        (this->Type_).onehotencoder_ = pOVar5;
      }
      pOVar5 = (this->Type_).onehotencoder_;
      if (from->_oneof_case_[0] == 600) {
        from_01 = (from->Type_).onehotencoder_;
      }
      else {
        from_01 = OneHotEncoder::default_instance();
      }
      OneHotEncoder::MergeFrom(pOVar5,from_01);
      break;
    case 0x259:
      if (this->_oneof_case_[0] != 0x259) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x259;
        pIVar14 = (Imputer *)operator_new(0x30);
        Imputer::Imputer(pIVar14);
        (this->Type_).imputer_ = pIVar14;
      }
      pIVar14 = (this->Type_).imputer_;
      if (from->_oneof_case_[0] == 0x259) {
        from_03 = (from->Type_).imputer_;
      }
      else {
        from_03 = Imputer::default_instance();
      }
      Imputer::MergeFrom(pIVar14,from_03);
      break;
    case 0x25a:
      if (this->_oneof_case_[0] != 0x25a) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x25a;
        pFVar12 = (FeatureVectorizer *)operator_new(0x30);
        FeatureVectorizer::FeatureVectorizer(pFVar12);
        (this->Type_).featurevectorizer_ = pFVar12;
      }
      pFVar12 = (this->Type_).featurevectorizer_;
      if (from->_oneof_case_[0] == 0x25a) {
        from_00 = (from->Type_).featurevectorizer_;
      }
      else {
        from_00 = FeatureVectorizer::default_instance();
      }
      FeatureVectorizer::MergeFrom(pFVar12,from_00);
      break;
    case 0x25b:
      if (this->_oneof_case_[0] != 0x25b) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x25b;
        pDVar13 = (DictVectorizer *)operator_new(0x20);
        DictVectorizer::DictVectorizer(pDVar13);
        (this->Type_).dictvectorizer_ = pDVar13;
      }
      pDVar13 = (this->Type_).dictvectorizer_;
      if (from->_oneof_case_[0] == 0x25b) {
        from_02 = (from->Type_).dictvectorizer_;
      }
      else {
        from_02 = DictVectorizer::default_instance();
      }
      DictVectorizer::MergeFrom(pDVar13,from_02);
      break;
    case 0x25c:
      if (this->_oneof_case_[0] != 0x25c) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x25c;
        pSVar17 = (Scaler *)operator_new(0x40);
        Scaler::Scaler(pSVar17);
        (this->Type_).scaler_ = pSVar17;
      }
      pSVar17 = (this->Type_).scaler_;
      if (from->_oneof_case_[0] == 0x25c) {
        from_06 = (from->Type_).scaler_;
      }
      else {
        from_06 = Scaler::default_instance();
      }
      Scaler::MergeFrom(pSVar17,from_06);
      break;
    case 0x25e:
      if (this->_oneof_case_[0] != 0x25e) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x25e;
        pCVar15 = (CategoricalMapping *)operator_new(0x30);
        CategoricalMapping::CategoricalMapping(pCVar15);
        (this->Type_).categoricalmapping_ = pCVar15;
      }
      pCVar15 = (this->Type_).categoricalmapping_;
      if (from->_oneof_case_[0] == 0x25e) {
        from_04 = (from->Type_).categoricalmapping_;
      }
      else {
        from_04 = CategoricalMapping::default_instance();
      }
      CategoricalMapping::MergeFrom(pCVar15,from_04);
      break;
    case 0x25f:
      if (this->_oneof_case_[0] != 0x25f) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x25f;
        pNVar16 = (Normalizer *)operator_new(0x18);
        Normalizer::Normalizer(pNVar16);
        (this->Type_).normalizer_ = pNVar16;
      }
      pNVar16 = (this->Type_).normalizer_;
      if (from->_oneof_case_[0] == 0x25f) {
        from_05 = (from->Type_).normalizer_;
      }
      else {
        from_05 = Normalizer::default_instance();
      }
      Normalizer::MergeFrom(pNVar16,from_05);
      break;
    case 0x261:
      if (this->_oneof_case_[0] != 0x261) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x261;
        pAVar18 = (ArrayFeatureExtractor *)operator_new(0x28);
        ArrayFeatureExtractor::ArrayFeatureExtractor(pAVar18);
        (this->Type_).arrayfeatureextractor_ = pAVar18;
      }
      pAVar18 = (this->Type_).arrayfeatureextractor_;
      if (from->_oneof_case_[0] == 0x261) {
        from_07 = (from->Type_).arrayfeatureextractor_;
      }
      else {
        from_07 = ArrayFeatureExtractor::default_instance();
      }
      ArrayFeatureExtractor::MergeFrom(pAVar18,from_07);
      break;
    case 0x262:
      if (this->_oneof_case_[0] != 0x262) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x262;
        pNVar19 = (NonMaximumSuppression *)operator_new(0x70);
        NonMaximumSuppression::NonMaximumSuppression(pNVar19);
        (this->Type_).nonmaximumsuppression_ = pNVar19;
      }
      pNVar19 = (this->Type_).nonmaximumsuppression_;
      if (from->_oneof_case_[0] == 0x262) {
        from_08 = (from->Type_).nonmaximumsuppression_;
      }
      else {
        from_08 = NonMaximumSuppression::default_instance();
      }
      NonMaximumSuppression::MergeFrom(pNVar19,from_08);
    }
  }
  else {
    switch(uVar1) {
    case 2000:
      if (this->_oneof_case_[0] != 2000) {
        clear_Type(this);
        this->_oneof_case_[0] = 2000;
        pTVar6 = (TextClassifier *)operator_new(0x38);
        CoreMLModels::TextClassifier::TextClassifier(pTVar6);
        (this->Type_).textclassifier_ = pTVar6;
      }
      pTVar6 = (this->Type_).textclassifier_;
      if (from->_oneof_case_[0] == 2000) {
        from_21 = (from->Type_).textclassifier_;
      }
      else {
        from_21 = CoreMLModels::TextClassifier::default_instance();
      }
      CoreMLModels::TextClassifier::MergeFrom(pTVar6,from_21);
      break;
    case 0x7d1:
      if (this->_oneof_case_[0] != 0x7d1) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d1;
        pWVar32 = (WordTagger *)operator_new(0x58);
        CoreMLModels::WordTagger::WordTagger(pWVar32);
        (this->Type_).wordtagger_ = pWVar32;
      }
      pWVar32 = (this->Type_).wordtagger_;
      if (from->_oneof_case_[0] == 0x7d1) {
        from_22 = (from->Type_).wordtagger_;
      }
      else {
        from_22 = CoreMLModels::WordTagger::default_instance();
      }
      CoreMLModels::WordTagger::MergeFrom(pWVar32,from_22);
      break;
    case 0x7d2:
      if (this->_oneof_case_[0] != 0x7d2) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d2;
        pVVar24 = (VisionFeaturePrint *)operator_new(0x20);
        CoreMLModels::VisionFeaturePrint::VisionFeaturePrint(pVVar24);
        (this->Type_).visionfeatureprint_ = pVVar24;
      }
      pVVar24 = (this->Type_).visionfeatureprint_;
      if (from->_oneof_case_[0] == 0x7d2) {
        from_13 = (from->Type_).visionfeatureprint_;
      }
      else {
        from_13 = CoreMLModels::VisionFeaturePrint::default_instance();
      }
      CoreMLModels::VisionFeaturePrint::MergeFrom(pVVar24,from_13);
      break;
    case 0x7d3:
      if (this->_oneof_case_[0] != 0x7d3) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d3;
        pSVar29 = (SoundAnalysisPreprocessing *)operator_new(0x20);
        CoreMLModels::SoundAnalysisPreprocessing::SoundAnalysisPreprocessing(pSVar29);
        (this->Type_).soundanalysispreprocessing_ = pSVar29;
      }
      pSVar29 = (this->Type_).soundanalysispreprocessing_;
      if (from->_oneof_case_[0] == 0x7d3) {
        from_18 = (from->Type_).soundanalysispreprocessing_;
      }
      else {
        from_18 = CoreMLModels::SoundAnalysisPreprocessing::default_instance();
      }
      CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(pSVar29,from_18);
      break;
    case 0x7d4:
      if (this->_oneof_case_[0] != 0x7d4) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d4;
        pGVar21 = (Gazetteer *)operator_new(0x38);
        CoreMLModels::Gazetteer::Gazetteer(pGVar21);
        (this->Type_).gazetteer_ = pGVar21;
      }
      pGVar21 = (this->Type_).gazetteer_;
      if (from->_oneof_case_[0] == 0x7d4) {
        from_10 = (from->Type_).gazetteer_;
      }
      else {
        from_10 = CoreMLModels::Gazetteer::default_instance();
      }
      CoreMLModels::Gazetteer::MergeFrom(pGVar21,from_10);
      break;
    case 0x7d5:
      if (this->_oneof_case_[0] != 0x7d5) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d5;
        pWVar38 = (WordEmbedding *)operator_new(0x28);
        CoreMLModels::WordEmbedding::WordEmbedding(pWVar38);
        (this->Type_).wordembedding_ = pWVar38;
      }
      pWVar38 = (this->Type_).wordembedding_;
      if (from->_oneof_case_[0] == 0x7d5) {
        from_30 = (from->Type_).wordembedding_;
      }
      else {
        from_30 = CoreMLModels::WordEmbedding::default_instance();
      }
      CoreMLModels::WordEmbedding::MergeFrom(pWVar38,from_30);
      break;
    case 0x7d6:
      if (this->_oneof_case_[0] != 0x7d6) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d6;
        pAVar39 = (AudioFeaturePrint *)operator_new(0x20);
        CoreMLModels::AudioFeaturePrint::AudioFeaturePrint(pAVar39);
        (this->Type_).audiofeatureprint_ = pAVar39;
      }
      pAVar39 = (this->Type_).audiofeatureprint_;
      if (from->_oneof_case_[0] == 0x7d6) {
        from_31 = (from->Type_).audiofeatureprint_;
      }
      else {
        from_31 = CoreMLModels::AudioFeaturePrint::default_instance();
      }
      CoreMLModels::AudioFeaturePrint::MergeFrom(pAVar39,from_31);
      break;
    default:
      if (uVar1 == 900) {
        if (this->_oneof_case_[0] != 900) {
          clear_Type(this);
          this->_oneof_case_[0] = 900;
          pIVar36 = (Identity *)operator_new(0x18);
          Identity::Identity(pIVar36);
          (this->Type_).identity_ = pIVar36;
        }
        pIVar36 = (this->Type_).identity_;
        if (from->_oneof_case_[0] == 900) {
          from_27 = (from->Type_).identity_;
        }
        else {
          from_27 = Identity::default_instance();
        }
        Identity::MergeFrom(pIVar36,from_27);
      }
      else if (uVar1 == 3000) {
        if (this->_oneof_case_[0] != 3000) {
          clear_Type(this);
          this->_oneof_case_[0] = 3000;
          pSVar10 = (SerializedModel *)operator_new(0x28);
          SerializedModel::SerializedModel(pSVar10);
          (this->Type_).serializedmodel_ = pSVar10;
        }
        pSVar10 = (this->Type_).serializedmodel_;
        if (from->_oneof_case_[0] == 3000) {
          from_34 = (from->Type_).serializedmodel_;
        }
        else {
          protobuf_Model_2eproto::InitDefaults();
          from_34 = (SerializedModel *)&_SerializedModel_default_instance_;
        }
        SerializedModel::MergeFrom(pSVar10,from_34);
      }
    }
  }
  return;
}

Assistant:

void Model::MergeFrom(const Model& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Model)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_description()) {
    mutable_description()->::CoreML::Specification::ModelDescription::MergeFrom(from.description());
  }
  if (from.specificationversion() != 0) {
    set_specificationversion(from.specificationversion());
  }
  if (from.isupdatable() != 0) {
    set_isupdatable(from.isupdatable());
  }
  switch (from.Type_case()) {
    case kPipelineClassifier: {
      mutable_pipelineclassifier()->::CoreML::Specification::PipelineClassifier::MergeFrom(from.pipelineclassifier());
      break;
    }
    case kPipelineRegressor: {
      mutable_pipelineregressor()->::CoreML::Specification::PipelineRegressor::MergeFrom(from.pipelineregressor());
      break;
    }
    case kPipeline: {
      mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
      break;
    }
    case kGlmRegressor: {
      mutable_glmregressor()->::CoreML::Specification::GLMRegressor::MergeFrom(from.glmregressor());
      break;
    }
    case kSupportVectorRegressor: {
      mutable_supportvectorregressor()->::CoreML::Specification::SupportVectorRegressor::MergeFrom(from.supportvectorregressor());
      break;
    }
    case kTreeEnsembleRegressor: {
      mutable_treeensembleregressor()->::CoreML::Specification::TreeEnsembleRegressor::MergeFrom(from.treeensembleregressor());
      break;
    }
    case kNeuralNetworkRegressor: {
      mutable_neuralnetworkregressor()->::CoreML::Specification::NeuralNetworkRegressor::MergeFrom(from.neuralnetworkregressor());
      break;
    }
    case kBayesianProbitRegressor: {
      mutable_bayesianprobitregressor()->::CoreML::Specification::BayesianProbitRegressor::MergeFrom(from.bayesianprobitregressor());
      break;
    }
    case kGlmClassifier: {
      mutable_glmclassifier()->::CoreML::Specification::GLMClassifier::MergeFrom(from.glmclassifier());
      break;
    }
    case kSupportVectorClassifier: {
      mutable_supportvectorclassifier()->::CoreML::Specification::SupportVectorClassifier::MergeFrom(from.supportvectorclassifier());
      break;
    }
    case kTreeEnsembleClassifier: {
      mutable_treeensembleclassifier()->::CoreML::Specification::TreeEnsembleClassifier::MergeFrom(from.treeensembleclassifier());
      break;
    }
    case kNeuralNetworkClassifier: {
      mutable_neuralnetworkclassifier()->::CoreML::Specification::NeuralNetworkClassifier::MergeFrom(from.neuralnetworkclassifier());
      break;
    }
    case kKNearestNeighborsClassifier: {
      mutable_knearestneighborsclassifier()->::CoreML::Specification::KNearestNeighborsClassifier::MergeFrom(from.knearestneighborsclassifier());
      break;
    }
    case kNeuralNetwork: {
      mutable_neuralnetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.neuralnetwork());
      break;
    }
    case kItemSimilarityRecommender: {
      mutable_itemsimilarityrecommender()->::CoreML::Specification::ItemSimilarityRecommender::MergeFrom(from.itemsimilarityrecommender());
      break;
    }
    case kMlProgram: {
      mutable_mlprogram()->::CoreML::Specification::MILSpec::Program::MergeFrom(from.mlprogram());
      break;
    }
    case kCustomModel: {
      mutable_custommodel()->::CoreML::Specification::CustomModel::MergeFrom(from.custommodel());
      break;
    }
    case kLinkedModel: {
      mutable_linkedmodel()->::CoreML::Specification::LinkedModel::MergeFrom(from.linkedmodel());
      break;
    }
    case kOneHotEncoder: {
      mutable_onehotencoder()->::CoreML::Specification::OneHotEncoder::MergeFrom(from.onehotencoder());
      break;
    }
    case kImputer: {
      mutable_imputer()->::CoreML::Specification::Imputer::MergeFrom(from.imputer());
      break;
    }
    case kFeatureVectorizer: {
      mutable_featurevectorizer()->::CoreML::Specification::FeatureVectorizer::MergeFrom(from.featurevectorizer());
      break;
    }
    case kDictVectorizer: {
      mutable_dictvectorizer()->::CoreML::Specification::DictVectorizer::MergeFrom(from.dictvectorizer());
      break;
    }
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::Scaler::MergeFrom(from.scaler());
      break;
    }
    case kCategoricalMapping: {
      mutable_categoricalmapping()->::CoreML::Specification::CategoricalMapping::MergeFrom(from.categoricalmapping());
      break;
    }
    case kNormalizer: {
      mutable_normalizer()->::CoreML::Specification::Normalizer::MergeFrom(from.normalizer());
      break;
    }
    case kArrayFeatureExtractor: {
      mutable_arrayfeatureextractor()->::CoreML::Specification::ArrayFeatureExtractor::MergeFrom(from.arrayfeatureextractor());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppression::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kIdentity: {
      mutable_identity()->::CoreML::Specification::Identity::MergeFrom(from.identity());
      break;
    }
    case kTextClassifier: {
      mutable_textclassifier()->::CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom(from.textclassifier());
      break;
    }
    case kWordTagger: {
      mutable_wordtagger()->::CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(from.wordtagger());
      break;
    }
    case kVisionFeaturePrint: {
      mutable_visionfeatureprint()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint::MergeFrom(from.visionfeatureprint());
      break;
    }
    case kSoundAnalysisPreprocessing: {
      mutable_soundanalysispreprocessing()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(from.soundanalysispreprocessing());
      break;
    }
    case kGazetteer: {
      mutable_gazetteer()->::CoreML::Specification::CoreMLModels::Gazetteer::MergeFrom(from.gazetteer());
      break;
    }
    case kWordEmbedding: {
      mutable_wordembedding()->::CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom(from.wordembedding());
      break;
    }
    case kAudioFeaturePrint: {
      mutable_audiofeatureprint()->::CoreML::Specification::CoreMLModels::AudioFeaturePrint::MergeFrom(from.audiofeatureprint());
      break;
    }
    case kSerializedModel: {
      mutable_serializedmodel()->::CoreML::Specification::SerializedModel::MergeFrom(from.serializedmodel());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}